

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void Catch::defaultListListeners
               (ostream *out,
               vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
               *descriptions)

{
  pointer pLVar1;
  char *pcVar2;
  pointer pcVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pLVar6;
  long *plVar7;
  long *plVar8;
  pointer pLVar9;
  char local_111;
  long *local_110;
  long local_108;
  long local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  long *local_f0;
  ulong local_e8;
  long local_e0 [2];
  size_t local_d0;
  size_type local_c8;
  size_t local_c0;
  Column local_b8;
  Column local_80;
  Columns local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"Registered listeners:\n",0x16);
  pLVar9 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pLVar6 = pLVar9;
  pLVar5 = pLVar9;
  if (pLVar9 != pLVar1) {
    while (pLVar4 = pLVar6, pLVar5 = pLVar5 + 1, pLVar5 != pLVar1) {
      pLVar6 = pLVar5;
      if ((pLVar5->name).m_size <= (pLVar4->name).m_size) {
        pLVar6 = pLVar4;
      }
    }
    local_c8 = (pLVar4->name).m_size;
    local_c0 = local_c8 + 5;
    local_d0 = 0x48 - local_c8;
    do {
      pcVar2 = (pLVar9->name).m_start;
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,pcVar2,pcVar2 + (pLVar9->name).m_size);
      plVar7 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_f0,local_e8,0,'\x01');
      local_110 = &local_100;
      plVar8 = plVar7 + 2;
      if ((long *)*plVar7 == plVar8) {
        local_100 = *plVar8;
        uStack_f8 = (undefined4)plVar7[3];
        uStack_f4 = *(undefined4 *)((long)plVar7 + 0x1c);
      }
      else {
        local_100 = *plVar8;
        local_110 = (long *)*plVar7;
      }
      local_108 = plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_b8.m_string._M_dataplus._M_p = (pointer)&local_b8.m_string.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_110,local_108 + (long)local_110);
      local_b8.m_width = 0x4f;
      local_b8.m_initialIndent = 0xffffffffffffffff;
      local_b8.m_indent = 2;
      if (local_c0 == 0) {
LAB_0015dcba:
        __assert_fail("newWidth > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                      ,0x2862,"Column &Catch::TextFlow::Column::width(size_t)");
      }
      local_b8.m_width = local_c0;
      local_80.m_string._M_dataplus._M_p = (pointer)&local_80.m_string.field_2;
      pcVar3 = (pLVar9->description)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar3,pcVar3 + (pLVar9->description)._M_string_length);
      local_80.m_width = 0x4f;
      local_80.m_initialIndent = 0;
      local_80.m_indent = 2;
      if (local_c8 == 0x48) goto LAB_0015dcba;
      local_80.m_width = local_d0;
      TextFlow::Column::operator+(&local_48,&local_b8,&local_80);
      TextFlow::operator<<(out,&local_48);
      local_111 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_111,1);
      std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
                (&local_48.m_columns);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_string._M_dataplus._M_p != &local_80.m_string.field_2) {
        operator_delete(local_80.m_string._M_dataplus._M_p,
                        local_80.m_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.m_string._M_dataplus._M_p != &local_b8.m_string.field_2) {
        operator_delete(local_b8.m_string._M_dataplus._M_p,
                        local_b8.m_string.field_2._M_allocated_capacity + 1);
      }
      if (local_110 != &local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
      }
      pLVar9 = pLVar9 + 1;
    } while (pLVar9 != pLVar1);
    local_b8.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_b8,1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void defaultListListeners( std::ostream& out,
                               std::vector<ListenerDescription> const& descriptions ) {
        out << "Registered listeners:\n";

        if(descriptions.empty()) {
            return;
        }

        const auto maxNameLen =
            std::max_element( descriptions.begin(),
                              descriptions.end(),
                              []( ListenerDescription const& lhs,
                                  ListenerDescription const& rhs ) {
                                  return lhs.name.size() < rhs.name.size();
                              } )
                ->name.size();

        for ( auto const& desc : descriptions ) {
            out << TextFlow::Column( static_cast<std::string>( desc.name ) +
                                     ':' )
                           .indent( 2 )
                           .width( maxNameLen + 5 ) +
                       TextFlow::Column( desc.description )
                           .initialIndent( 0 )
                           .indent( 2 )
                           .width( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen - 8 )
                << '\n';
        }

        out << '\n' << std::flush;
    }